

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O2

void __thiscall QGraphicsColorizeEffect::setStrength(QGraphicsColorizeEffect *this,qreal strength)

{
  long lVar1;
  qreal p1;
  bool bVar2;
  ulong uVar3;
  
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  p1 = QPixmapColorizeFilter::strength(*(QPixmapColorizeFilter **)(lVar1 + 0xa8));
  bVar2 = qFuzzyCompare(p1,strength);
  if (bVar2) {
    return;
  }
  QPixmapColorizeFilter::setStrength(*(QPixmapColorizeFilter **)(lVar1 + 0xa8),strength);
  uVar3 = -(ulong)(strength < -strength);
  *(uint *)(lVar1 + 0xb0) =
       *(uint *)(lVar1 + 0xb0) & 0xfffffffe |
       (uint)(1e-12 < (double)(~uVar3 & (ulong)strength | (ulong)-strength & uVar3));
  QGraphicsEffect::update(&this->super_QGraphicsEffect);
  strengthChanged(this,strength);
  return;
}

Assistant:

void QGraphicsColorizeEffect::setStrength(qreal strength)
{
    Q_D(QGraphicsColorizeEffect);
    if (qFuzzyCompare(d->filter->strength(), strength))
        return;

    d->filter->setStrength(strength);
    d->opaque = !qFuzzyIsNull(strength);
    update();
    emit strengthChanged(strength);
}